

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_STAR(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t dam;
  loc finish;
  long lVar2;
  source sVar3;
  source origin;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  if (player->timed[2] == 0) {
    msg("Light shoots in all directions!");
  }
  lVar2 = 0;
  do {
    finish = (loc)loc_sum(player->grid,(loc_conflict)ddgrid_ddd[lVar2]);
    sVar3 = source_player();
    origin._4_4_ = 0;
    origin.what = sVar3.what;
    origin.which.trap = sVar3.which.trap;
    _Var1 = project(origin,L'\0',finish,dam,context->subtype,L'V',L'\0','\0',context->obj);
    if (_Var1) {
      context->ident = true;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return true;
}

Assistant:

bool effect_handler_STAR(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int i;
	struct loc target;

	int flg = PROJECT_THRU | PROJECT_BEAM | PROJECT_GRID | PROJECT_KILL;

	/* Describe */
	if (!player->timed[TMD_BLIND])
		msg("Light shoots in all directions!");

	for (i = 0; i < 8; i++) {
		/* Use the current direction */
		target = loc_sum(player->grid, ddgrid_ddd[i]);

		/* Aim at the target */
		if (project(source_player(), 0, target, dam, context->subtype, flg, 0,
					0, context->obj))
			context->ident = true;
	}

	return true;
}